

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::fillImage<int,4u>
               (GLsizei image_width,GLsizei image_height,int *pixel_components,int *out_data)

{
  uint local_38;
  int local_34;
  GLuint component;
  GLsizei x;
  GLuint line_offset;
  GLsizei y;
  GLuint n_components_per_line;
  GLuint n_components_per_pixel;
  int *out_data_local;
  int *pixel_components_local;
  GLsizei image_height_local;
  GLsizei image_width_local;
  
  for (x = 0; x < image_height; x = x + 1) {
    for (local_34 = 0; local_34 < image_width; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        out_data[x * image_width * 4 + local_34 * 4 + local_38] = pixel_components[local_38];
      }
    }
  }
  return;
}

Assistant:

void fillImage(glw::GLsizei image_width, glw::GLsizei image_height, const T* pixel_components, T* out_data)
{
	const glw::GLuint n_components_per_pixel = N_Components;
	const glw::GLuint n_components_per_line  = n_components_per_pixel * image_width;

	for (glw::GLsizei y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * n_components_per_line;

		for (glw::GLsizei x = 0; x < image_width; ++x)
		{
			for (glw::GLuint component = 0; component < n_components_per_pixel; ++component)
			{
				out_data[line_offset + x * n_components_per_pixel + component] = pixel_components[component];
			}
		}
	}
}